

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt.cpp
# Opt level: O0

Required *
parse_pattern(string *source,vector<docopt::Option,_std::allocator<docopt::Option>_> *options)

{
  undefined1 uVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  Required *in_RDI;
  vector<docopt::Option,_std::allocator<docopt::Option>_> *in_stack_00000030;
  Tokens *in_stack_00000038;
  PatternList result;
  Tokens tokens;
  string *in_stack_fffffffffffffee8;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  *pvVar2;
  Tokens *in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef8;
  Required *this;
  vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
  local_e8;
  undefined1 local_c9;
  Tokens *in_stack_ffffffffffffff58;
  string *in_stack_ffffffffffffffd8;
  
  this = in_RDI;
  Tokens::from_pattern(in_stack_ffffffffffffffd8);
  parse_expr(in_stack_00000038,in_stack_00000030);
  uVar1 = Tokens::operator_cast_to_bool(in_stack_fffffffffffffef0);
  if (!(bool)uVar1) {
    pvVar2 = &local_e8;
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
            *)in_stack_fffffffffffffef0,pvVar2);
    docopt::Required::BranchPattern((Required *)in_stack_fffffffffffffef0,pvVar2);
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    ~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             *)this);
    std::
    vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>::
    ~vector((vector<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             *)this);
    Tokens::~Tokens((Tokens *)0x2b9c3b);
    return in_RDI;
  }
  local_c9 = 1;
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          __cxa_allocate_exception(0x10);
  Tokens::the_rest_abi_cxx11_(in_stack_ffffffffffffff58);
  std::operator+((char *)CONCAT17(uVar1,in_stack_fffffffffffffef8),__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar1,in_stack_fffffffffffffef8),(char *)__rhs);
  docopt::DocoptLanguageError::runtime_error((DocoptLanguageError *)__rhs,in_stack_fffffffffffffee8)
  ;
  local_c9 = 0;
  __cxa_throw(__rhs,&docopt::DocoptLanguageError::typeinfo,
              docopt::DocoptLanguageError::~DocoptLanguageError);
}

Assistant:

Required parse_pattern(std::string const& source, std::vector<Option>& options)
{
	auto tokens = Tokens::from_pattern(source);
	auto result = parse_expr(tokens, options);
	
	if (tokens)
		throw DocoptLanguageError("Unexpected ending: '" + tokens.the_rest() + "'");
	
	assert(result.size() == 1  &&  "top level is always one big");
	return Required{ std::move(result) };
}